

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

float rr::anon_unknown_19::findTriangleVertexDepthSlope(Vec4 *p,Vec4 *v0,Vec4 *v1)

{
  undefined8 uVar1;
  ulong uVar2;
  int i;
  long lVar3;
  uint uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  Vec3 b;
  Vec3 a;
  undefined8 local_20;
  float local_18;
  undefined8 local_10;
  float local_8;
  undefined1 auVar7 [16];
  
  local_10 = *(undefined8 *)p->m_data;
  local_8 = p->m_data[2];
  uVar1 = *(undefined8 *)v1->m_data;
  fVar14 = v1->m_data[2];
  b.m_data._0_8_ = *(undefined8 *)v0->m_data;
  b.m_data[2] = v0->m_data[2];
  local_20 = local_10;
  local_18 = local_8;
  a.m_data[0] = 0.0;
  a.m_data[1] = 0.0;
  a.m_data[2] = 0.0;
  lVar3 = 0;
  do {
    a.m_data[lVar3] = b.m_data[lVar3] - *(float *)((long)&local_20 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_20 = uVar1;
  local_18 = fVar14;
  b.m_data[0] = 0.0;
  b.m_data[1] = 0.0;
  b.m_data[2] = 0.0;
  lVar3 = 0;
  do {
    b.m_data[lVar3] =
         *(float *)((long)&local_20 + lVar3 * 4) - *(float *)((long)&local_10 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  fVar13 = a.m_data[0] * b.m_data[1] - a.m_data[1] * b.m_data[0];
  fVar14 = -fVar13;
  if (-fVar13 <= fVar13) {
    fVar14 = fVar13;
  }
  fVar5 = 0.0;
  if (0.0001 <= fVar14) {
    auVar8._4_8_ = 0;
    auVar8._0_4_ = b.m_data[1];
    auVar8._12_4_ = 0x80000000;
    auVar7._8_8_ = auVar8._8_8_;
    auVar7._0_8_ = CONCAT44(b.m_data[0],b.m_data[1]) ^ 0x8000000000000000;
    auVar9._4_4_ = fVar13;
    auVar9._0_4_ = fVar13;
    auVar9._8_4_ = fVar13;
    auVar9._12_4_ = fVar13;
    auVar9 = divps(auVar7,auVar9);
    auVar10._0_8_ = CONCAT44(a.m_data[0],a.m_data[1]) ^ 0x80000000;
    auVar10._8_4_ = 0x80000000;
    auVar10._12_4_ = 0;
    auVar11._4_4_ = fVar13;
    auVar11._0_4_ = fVar13;
    auVar11._8_4_ = fVar13;
    auVar11._12_4_ = fVar13;
    auVar11 = divps(auVar10,auVar11);
    auVar12._0_4_ = a.m_data[2] * auVar9._0_4_ + b.m_data[2] * auVar11._0_4_;
    auVar12._4_4_ = a.m_data[2] * auVar9._4_4_ + b.m_data[2] * auVar11._4_4_;
    auVar12._8_4_ = a.m_data[2] * auVar9._8_4_ + b.m_data[2] * auVar11._8_4_;
    auVar12._12_4_ = a.m_data[2] * auVar9._12_4_ + b.m_data[2] * auVar11._12_4_;
    uVar2 = CONCAT44(auVar12._4_4_,auVar12._0_4_);
    auVar6._0_8_ = uVar2 ^ 0x8000000080000000;
    auVar6._8_4_ = -auVar12._8_4_;
    auVar6._12_4_ = -auVar12._12_4_;
    auVar9 = maxps(auVar6,auVar12);
    uVar4 = -(uint)(auVar9._4_4_ <= auVar9._0_4_);
    fVar5 = (float)(~uVar4 & (uint)auVar9._4_4_ | (uint)auVar9._0_4_ & uVar4);
  }
  return fVar5;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }